

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

Ref __thiscall cashew::ValueBuilder::makeLabel(ValueBuilder *this,IString name,Ref body)

{
  Value *pVVar1;
  Ref RVar2;
  Ref local_30;
  Ref local_28;
  Ref body_local;
  IString name_local;
  
  local_28.inst = (Value *)name.str._M_str;
  name_local.str._M_len = name.str._M_len;
  body_local.inst = (Value *)this;
  local_30 = makeRawArray(3);
  pVVar1 = Ref::operator->(&local_30);
  RVar2 = makeRawString((IString *)&LABEL);
  pVVar1 = Value::push_back(pVVar1,RVar2);
  RVar2 = makeRawString((IString *)&body_local);
  pVVar1 = Value::push_back(pVVar1,RVar2);
  pVVar1 = Value::push_back(pVVar1,local_28);
  Ref::Ref((Ref *)&name_local.str._M_str,pVVar1);
  return (Ref)(Value *)name_local.str._M_str;
}

Assistant:

static Ref makeLabel(IString name, Ref body) {
    return &makeRawArray(3)
              ->push_back(makeRawString(LABEL))
              .push_back(makeRawString(name))
              .push_back(body);
  }